

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O0

int __thiscall
CVmObjLookupTable::getp_count_buckets
          (CVmObjLookupTable *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  int iVar1;
  uint intval;
  vm_val_t *in_RDX;
  uint *in_RDI;
  CVmNativeCodeDesc *in_stack_ffffffffffffffb8;
  vm_val_t *in_stack_ffffffffffffffc8;
  
  if ((getp_count_buckets(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_count_buckets(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_count_buckets::desc,0);
    __cxa_guard_release(&getp_count_buckets(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc(in_stack_ffffffffffffffc8,in_RDI,in_stack_ffffffffffffffb8)
  ;
  if (iVar1 == 0) {
    intval = get_bucket_count((CVmObjLookupTable *)0x36880b);
    vm_val_t::set_int(in_RDX,intval);
  }
  return 1;
}

Assistant:

int CVmObjLookupTable::getp_count_buckets(VMG_ vm_obj_id_t self,
                                          vm_val_t *retval, uint *argc)
{
    static CVmNativeCodeDesc desc(0);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* return the number of buckets */
    retval->set_int(get_bucket_count());

    /* handled */
    return TRUE;
}